

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O2

int compaction_del_cb(fdb_file_handle *fhandle,fdb_compaction_status status,char *kv_name,
                     fdb_doc *doc,uint64_t old_offset,uint64_t new_offset,void *ctx)

{
  fdb_kvs_handle *pfVar1;
  fdb_status fVar2;
  size_t sVar3;
  uint uVar4;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  timeval __test_begin;
  char keybuf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  pfVar1 = *ctx;
  db = pfVar1;
  if (status != 0x10) {
    if (status == 8) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x9bc);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x9bc,
                    "int compaction_del_cb(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                   );
    }
    if (status != 2) {
      if (status == 1) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x99f);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x99f,
                      "int compaction_del_cb(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                     );
      }
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x9c0);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x9c0,
                    "int compaction_del_cb(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                   );
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x9be);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x9be,
                  "int compaction_del_cb(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                 );
  }
  if (kv_name != (char *)0x0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x9a1);
    __assert_fail("!kv_name",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x9a1,
                  "int compaction_del_cb(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                 );
  }
  if (pfVar1 != (fdb_kvs_handle *)0x0) {
    fVar2 = fdb_open(&dbfile,"./compact_test1",&fhandle->root->config);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x9a4);
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x9a4,
                    "int compaction_del_cb(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                   );
    }
    fdb_kvs_open_default(dbfile,&db,&pfVar1->kvs_config);
    uVar4 = 0;
    while (uVar4 != 10) {
      sprintf(keybuf,"key%d",(ulong)uVar4);
      pfVar1 = db;
      sVar3 = strlen(keybuf);
      fVar2 = fdb_del_kv(pfVar1,keybuf,sVar3);
      uVar4 = uVar4 + 1;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x9a9);
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x9a9,
                      "int compaction_del_cb(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                     );
      }
    }
    uVar4 = 0;
    while (uVar4 != 10) {
      sprintf(keybuf,"KEY%d",(ulong)uVar4);
      pfVar1 = db;
      sVar3 = strlen(keybuf);
      fVar2 = fdb_set_kv(pfVar1,keybuf,sVar3,(void *)0x0,0);
      pfVar1 = db;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x9af);
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x9af,
                      "int compaction_del_cb(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                     );
      }
      sVar3 = strlen(keybuf);
      fVar2 = fdb_del_kv(pfVar1,keybuf,sVar3);
      uVar4 = uVar4 + 1;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x9b1);
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x9b1,
                      "int compaction_del_cb(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                     );
      }
    }
    sprintf(keybuf,"key%d",10);
    pfVar1 = db;
    sVar3 = strlen(keybuf);
    fVar2 = fdb_set_kv(pfVar1,keybuf,sVar3,(void *)0x0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x9b5);
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x9b5,
                    "int compaction_del_cb(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                   );
    }
    fVar2 = fdb_commit(dbfile,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x9b7);
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x9b7,
                    "int compaction_del_cb(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                   );
    }
    fdb_close(dbfile);
    *(undefined8 *)ctx = 0;
  }
  return 0;
}

Assistant:

static int compaction_del_cb(fdb_file_handle *fhandle,
                             fdb_compaction_status status,
                             const char *kv_name,
                             fdb_doc *doc, uint64_t old_offset,
                             uint64_t new_offset,
                             void *ctx)
{
    TEST_INIT();
    fdb_status s;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db = *(fdb_kvs_handle **)ctx;
    int i;
    int n = 10; // if changing this change caller function too
    char keybuf[256];
    (void) doc;
    (void) new_offset;
    (void) old_offset;

    if (status == FDB_CS_BEGIN) {
        TEST_CHK(false);
    } else if (status == FDB_CS_END) {
        TEST_CHK(!kv_name);
        if (db) { // At end of first phase, mutate more docs...
            s = fdb_open(&dbfile, "./compact_test1", &fhandle->root->config);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
            fdb_kvs_open_default(dbfile, &db, &db->kvs_config);
            for (i = 0; i < n; ++i){
                sprintf(keybuf, "key%d", i);
                s = fdb_del_kv(db, keybuf, strlen(keybuf));
                TEST_CHK(s == FDB_RESULT_SUCCESS);
            }
            // Now insert and delete a bunch of keys (all in WAL)
            for (i = 0; i < n; ++i){
                sprintf(keybuf, "KEY%d", i);
                s = fdb_set_kv(db, keybuf, strlen(keybuf), NULL, 0);
                TEST_CHK(s == FDB_RESULT_SUCCESS);
                s = fdb_del_kv(db, keybuf, strlen(keybuf));
                TEST_CHK(s == FDB_RESULT_SUCCESS);
            }
            sprintf(keybuf, "key%d", i);
            s = fdb_set_kv(db, keybuf, strlen(keybuf), NULL, 0);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
            s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
            fdb_close(dbfile);
            *(fdb_kvs_handle **)ctx = NULL; // Don't run in 2nd, 3rd phases
        }
    } else if (status == FDB_CS_FLUSH_WAL) {
        TEST_CHK(false);
    } else if (status == FDB_CS_MOVE_DOC) {
        TEST_CHK(false);
    } else { // FDB_CS_BATCH_MOVE
        TEST_CHK(false);
    }
    return 0;
}